

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_hanning_window.c
# Opt level: O0

void WebRtcSpl_GetHanningWindow(int16_t *v,size_t size)

{
  int32_t iVar1;
  int local_2c;
  int32_t factor;
  int32_t index;
  int16_t *vptr1;
  size_t jj;
  size_t size_local;
  int16_t *v_local;
  
  iVar1 = WebRtcSpl_DivW32W16(0x40000000,(int16_t)size);
  if (size < 0x201) {
    local_2c = -0x200000;
  }
  else {
    local_2c = -0x100000;
  }
  _factor = v;
  for (vptr1 = (int16_t *)0x0; vptr1 < size; vptr1 = (int16_t *)((long)vptr1 + 1)) {
    local_2c = iVar1 + local_2c;
    *_factor = kHanningTable[local_2c >> 0x16];
    _factor = _factor + 1;
  }
  return;
}

Assistant:

void WebRtcSpl_GetHanningWindow(int16_t *v, size_t size)
{
    size_t jj;
    int16_t *vptr1;

    int32_t index;
    int32_t factor = ((int32_t)0x40000000);

    factor = WebRtcSpl_DivW32W16(factor, (int16_t)size);
    if (size < 513)
        index = (int32_t)-0x200000;
    else
        index = (int32_t)-0x100000;
    vptr1 = v;

    for (jj = 0; jj < size; jj++)
    {
        index += factor;
        (*vptr1++) = kHanningTable[index >> 22];
    }

}